

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Destroy<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  long lVar2;
  
  iVar1 = this->allocated_size_;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      if ((long *)this->elements_[lVar2] != (long *)0x0) {
        (**(code **)(*this->elements_[lVar2] + 8))();
        iVar1 = this->allocated_size_;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  if (this->elements_ != (void **)0x0) {
    operator_delete__(this->elements_);
    return;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Destroy() {
  for (int i = 0; i < allocated_size_; i++) {
    TypeHandler::Delete(cast<TypeHandler>(elements_[i]));
  }
  delete [] elements_;
}